

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_cry_Bio.cpp
# Opt level: O3

bool __thiscall axl::cry::Bio::createMemBuf(Bio *this,void *p,size_t size)

{
  bool bVar1;
  BIO *pBVar2;
  
  pBVar2 = (BIO *)(this->super_Handle<bio_st_*,_axl::cry::FreeBio,_axl::sl::Zero<bio_st_*>_>).m_h;
  if (pBVar2 != (BIO *)0x0) {
    BIO_free(pBVar2);
    (this->super_Handle<bio_st_*,_axl::cry::FreeBio,_axl::sl::Zero<bio_st_*>_>).m_h = (bio_st *)0x0;
  }
  pBVar2 = BIO_new_mem_buf(p,(int)size);
  (this->super_Handle<bio_st_*,_axl::cry::FreeBio,_axl::sl::Zero<bio_st_*>_>).m_h = (bio_st *)pBVar2
  ;
  bVar1 = completeWithLastCryptoError<bool>(pBVar2 != (BIO *)0x0,false);
  return bVar1;
}

Assistant:

bool
Bio::createMemBuf(
	const void* p,
	size_t size
) {
	close();
	m_h = BIO_new_mem_buf((void*)p, size);
	return completeWithLastCryptoError(m_h != NULL);
}